

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::prepareTopology(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  pointer pdVar2;
  pointer ppAVar3;
  pointer piVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  pointer ppAVar7;
  _Base_ptr p_Var8;
  Atom *pAVar9;
  CutoffGroup *this_00;
  _Base_ptr p_Var10;
  RealType RVar11;
  double dVar12;
  int reg;
  value_type_conflict local_48;
  int local_3c;
  _Rb_tree_node_base *local_38;
  
  pdVar2 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_48 = 1.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->massFactors_,(ulong)(uint)this->nAtoms_,&local_48);
  p_Var6 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) goto LAB_0013ccb1;
  do {
    p_Var10 = (_Base_ptr)0x0;
    while( true ) {
      if (p_Var10 == (_Base_ptr)0x0) {
        piVar4 = (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar4) {
          (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar4;
        }
        std::vector<int,_std::allocator<int>_>::reserve
                  (&this->identArray_,(ulong)(uint)this->nAtoms_);
        piVar4 = (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar4) {
          (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar4;
        }
        std::vector<int,_std::allocator<int>_>::reserve(&this->regions_,(ulong)(uint)this->nAtoms_);
        local_38 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)local_38 == p_Var1) {
          p_Var6 = (_Base_ptr)0x0;
        }
        else {
          p_Var6 = local_38[1]._M_parent;
        }
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            local_48 = (value_type_conflict)
                       CONCAT44(local_48._4_4_,
                                *(undefined4 *)((long)&p_Var6[0xc]._M_parent[0xf]._M_left + 4));
            p_Var10 = p_Var6->_M_left;
            if (p_Var10 == p_Var6->_M_right) {
              p_Var8 = (_Base_ptr)0x0;
            }
            else {
              p_Var8 = *(_Base_ptr *)p_Var10;
            }
            while (p_Var8 != (_Base_ptr)0x0) {
              p_Var10 = (_Base_ptr)&p_Var10->_M_parent;
              local_3c = AtomType::getIdent((AtomType *)p_Var8[3]._M_right);
              iVar5._M_current =
                   (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&this->identArray_,iVar5,&local_3c);
              }
              else {
                *iVar5._M_current = local_3c;
                (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              iVar5._M_current =
                   (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&this->regions_,iVar5,(int *)&local_48
                          );
              }
              else {
                *iVar5._M_current = local_48._0_4_;
                (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              if (p_Var10 == p_Var6->_M_right) {
                p_Var8 = (_Base_ptr)0x0;
              }
              else {
                p_Var8 = *(_Base_ptr *)p_Var10;
              }
            }
            local_38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
            if ((_Rb_tree_header *)local_38 == p_Var1) {
              p_Var6 = (_Base_ptr)0x0;
            }
            else {
              p_Var6 = local_38[1]._M_parent;
            }
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        this->topologyDone_ = true;
        return;
      }
      p_Var8 = p_Var10[5]._M_right;
      while( true ) {
        if (p_Var8 == *(_Base_ptr *)(p_Var10 + 6)) {
          this_00 = (CutoffGroup *)0x0;
        }
        else {
          this_00 = *(CutoffGroup **)p_Var8;
        }
        if (this_00 == (CutoffGroup *)0x0) break;
        RVar11 = CutoffGroup::getMass(this_00);
        ppAVar7 = (this_00->cutoffAtomList).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar3 = (this_00->cutoffAtomList).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar7 == ppAVar3) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar7;
        }
        if (pAVar9 != (Atom *)0x0) {
          pdVar2 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            ppAVar7 = ppAVar7 + 1;
            dVar12 = 1.0;
            if ((RVar11 != 0.0) || (NAN(RVar11))) {
              dVar12 = (pAVar9->super_StuntDouble).mass_ / RVar11;
            }
            pdVar2[(pAVar9->super_StuntDouble).localIndex_] = dVar12;
            if (ppAVar7 == ppAVar3) {
              pAVar9 = (Atom *)0x0;
            }
            else {
              pAVar9 = *ppAVar7;
            }
          } while (pAVar9 != (Atom *)0x0);
        }
        p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      if ((_Rb_tree_header *)p_Var6 == p_Var1) break;
LAB_0013ccb1:
      p_Var10 = p_Var6[1]._M_parent;
    }
  } while( true );
}

Assistant:

void SimInfo::prepareTopology() {
    // calculate mass ratio of cutoff group
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;
    Molecule::AtomIterator ai;
    Atom* atom;
    RealType totalMass;

    /**
     * The mass factor is the relative mass of an atom to the total
     * mass of the cutoff group it belongs to.  By default, all atoms
     * are their own cutoff groups, and therefore have mass factors of
     * 1.  We need some special handling for massless atoms, which
     * will be treated as carrying the entire mass of the cutoff
     * group.
     */
    massFactors_.clear();
    massFactors_.resize(getNAtoms(), 1.0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        totalMass = cg->getMass();
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          // Check for massless groups - set mfact to 1 if true
          if (totalMass != 0)
            massFactors_[atom->getLocalIndex()] = atom->getMass() / totalMass;
          else
            massFactors_[atom->getLocalIndex()] = 1.0;
        }
      }
    }

    // Build the identArray_ and regions_

    identArray_.clear();
    identArray_.reserve(getNAtoms());
    regions_.clear();
    regions_.reserve(getNAtoms());

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      int reg = mol->getRegion();
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        identArray_.push_back(atom->getIdent());
        regions_.push_back(reg);
      }
    }

    topologyDone_ = true;
  }